

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  Reader reader;
  Builder builder_00;
  Reader reader_00;
  Reader reader_01;
  SegmentBuilder *pSVar1;
  Builder root;
  MallocMessageBuilder builder;
  SegmentBuilder *local_1a8;
  StructBuilder SStack_1a0;
  Builder local_178;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  SegmentBuilder *local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_178,&local_108.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_1a8,
             (EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  pSVar1 = local_1a8;
  StructBuilder::asReader(&SStack_1a0);
  local_140 = pSVar1;
  reader_01.reader.segment = (SegmentReader *)uStack_138;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)pSVar1;
  reader_01.reader.capTable = (CapTableReader *)local_130;
  reader_01.reader.data = (void *)uStack_128;
  reader_01.reader.pointers = (WirePointer *)local_120;
  reader_01.reader.dataSize = (undefined4)uStack_118;
  reader_01.reader.pointerCount = uStack_118._4_2_;
  reader_01.reader._38_2_ = uStack_118._6_2_;
  reader_01.reader._40_8_ = local_110;
  checkDynamicTestMessageAllZero(reader_01);
  pSVar1 = local_1a8;
  StructBuilder::asReader(&SStack_1a0);
  local_178.builder.segment = pSVar1;
  Schema::requireUsableAs((Schema *)&local_178,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  reader._reader.capTable = (CapTableReader *)local_178.builder.pointer;
  reader._reader.segment = (SegmentReader *)local_178.builder.capTable;
  reader._reader.data = (void *)local_160;
  reader._reader.pointers = (WirePointer *)uStack_158;
  reader._reader.dataSize = (undefined4)local_150;
  reader._reader.pointerCount = local_150._4_2_;
  reader._reader._38_2_ = local_150._6_2_;
  reader._reader._40_8_ = uStack_148;
  checkTestMessageAllZero(reader);
  builder_00.builder.segment = SStack_1a0.segment;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_1a8;
  builder_00.builder.capTable = SStack_1a0.capTable;
  builder_00.builder.data = SStack_1a0.data;
  builder_00.builder.pointers = SStack_1a0.pointers;
  builder_00.builder.dataSize = SStack_1a0.dataSize;
  builder_00.builder.pointerCount = SStack_1a0.pointerCount;
  builder_00.builder._38_2_ = SStack_1a0._38_2_;
  checkDynamicTestMessageAllZero(builder_00);
  StructBuilder::asReader(&SStack_1a0);
  local_178.builder.segment = local_1a8;
  Schema::requireUsableAs((Schema *)&local_178,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  reader_00._reader.capTable = (CapTableReader *)local_178.builder.pointer;
  reader_00._reader.segment = (SegmentReader *)local_178.builder.capTable;
  reader_00._reader.data = (void *)local_160;
  reader_00._reader.pointers = (WirePointer *)uStack_158;
  reader_00._reader.dataSize = (undefined4)local_150;
  reader_00._reader.pointerCount = local_150._4_2_;
  reader_00._reader._38_2_ = local_150._6_2_;
  reader_00._reader._40_8_ = uStack_148;
  checkTestMessageAllZero(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(DynamicApi, Zero) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  checkDynamicTestMessageAllZero(root.asReader());
  checkTestMessageAllZero(root.asReader().as<TestAllTypes>());
  checkDynamicTestMessageAllZero(root);
  checkTestMessageAllZero(root.asReader().as<TestAllTypes>());
}